

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskCase::preDraw(SampleMaskCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  RenderTarget *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  TestError *this_02;
  bool local_1f9;
  bool local_1eb;
  allocator<char> local_1e9;
  string local_1e8;
  int local_1c4;
  int maskLoc;
  MessageBuilder local_1a8;
  uint local_28;
  uint local_24;
  deUint32 effectiveMask;
  deUint32 maskMask;
  deUint32 fullMask;
  bool multisampleTarget;
  Functions *gl;
  SampleMaskCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _fullMask = CONCAT44(extraout_var,iVar2);
  local_1eb = true;
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples < 1) {
    local_1f9 = false;
    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        m_renderTarget == TARGET_DEFAULT) {
      this_00 = gles31::Context::getRenderTarget
                          ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                           super_MultisampleRenderCase.super_TestCase.m_context);
      iVar2 = tcu::RenderTarget::getNumSamples(this_00);
      local_1f9 = 1 < iVar2;
    }
    local_1eb = local_1f9;
  }
  maskMask._3_1_ = local_1eb;
  effectiveMask = 0xaaaaaaaa;
  local_24 = (1 << ((byte)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.m_numTargetSamples & 0x1f)) - 1;
  local_28 = local_24 & 0xaaaaaaaa;
  (**(code **)(_fullMask + 0x5e0))(0x8e51);
  (**(code **)(_fullMask + 0x1258))(0,local_28);
  dVar3 = (**(code **)(_fullMask + 0x800))();
  glu::checkError(dVar3,"set mask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x495);
  this_01 = tcu::TestContext::getLog
                      ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                       super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [21])"Setting sample mask ");
  tcu::Format::Hex<4UL>::Hex((Hex<4UL> *)&stack0xfffffffffffffe40,(ulong)local_28);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(Hex<4UL> *)&stack0xfffffffffffffe40);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  if ((maskMask._3_1_ & 1) != 0) {
    pcVar1 = *(code **)(_fullMask + 0xb48);
    dVar3 = glu::ShaderProgram::getProgram
                      ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                       super_MultisampleRenderCase.m_program);
    local_1c4 = (*pcVar1)(dVar3,"u_sampleMask");
    if (local_1c4 == -1) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"Location of u_mask was -1",&local_1e9);
      tcu::TestError::TestError(this_02,&local_1e8);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(_fullMask + 0x1500))(local_1c4,local_28);
    dVar3 = (**(code **)(_fullMask + 0x800))();
    glu::checkError(dVar3,"set mask uniform",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x4a1);
  }
  SampleMaskBaseCase::preDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskCase::preDraw (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				multisampleTarget	= (m_numRequestedSamples > 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() > 1);
	const deUint32			fullMask			= (deUint32)0xAAAAAAAAUL;
	const deUint32			maskMask			= (1U << m_numTargetSamples) - 1;
	const deUint32			effectiveMask		=  fullMask & maskMask;

	// set test mask
	gl.enable(GL_SAMPLE_MASK);
	gl.sampleMaski(0, effectiveMask);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set mask");

	m_testCtx.getLog() << tcu::TestLog::Message << "Setting sample mask " << tcu::Format::Hex<4>(effectiveMask) << tcu::TestLog::EndMessage;

	// set multisample case uniforms
	if (multisampleTarget)
	{
		const int maskLoc = gl.getUniformLocation(m_program->getProgram(), "u_sampleMask");
		if (maskLoc == -1)
			throw tcu::TestError("Location of u_mask was -1");

		gl.uniform1ui(maskLoc, effectiveMask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask uniform");
	}

	// base class logic
	SampleMaskBaseCase::preDraw();
}